

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::compiler::ValueTranslator::compileValueInner
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,ValueTranslator *this,Reader src,
          Type type)

{
  word **__return_storage_ptr___00;
  Resolver *pRVar1;
  ErrorReporter *pEVar2;
  double dVar3;
  Reader src_00;
  Builder builder;
  Reader copyFrom;
  Enumerant enumerant_00;
  Reader assignments;
  Type type_00;
  ListSchema schema;
  Type type_01;
  ArrayPtr<const_capnp::word> array;
  StringPtr name_00;
  undefined8 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  bool bVar9;
  Which WVar10;
  Which WVar11;
  uint uVar12;
  NullableValue<capnp::EnumSchema::Enumerant> *other;
  Enumerant *pEVar13;
  Enumerant *pEVar14;
  NullableValue<capnp::DynamicValue::Reader> *pNVar15;
  Reader *pRVar16;
  NullableValue<kj::Array<const_unsigned_char>_> *other_00;
  Array<const_unsigned_char> *pAVar17;
  char *__dest;
  Orphan<capnp::Text> *other_01;
  size_t sVar18;
  uchar *puVar19;
  word *pwVar20;
  uint64_t uVar21;
  unsigned_long uVar22;
  long value_00;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> *other_02;
  Orphan<capnp::DynamicValue> *pOVar23;
  Orphan<capnp::DynamicList> *other_03;
  Orphan<capnp::DynamicStruct> *other_04;
  StringPtr *this_00;
  char (*in_R8) [2];
  float value_01;
  ArrayPtr<const_capnp::word> AVar24;
  Type TVar25;
  DynamicEnum value_02;
  ReaderOptions options_00;
  Reader local_b10;
  Builder local_ae0;
  Schema local_ab0;
  undefined1 local_aa8 [8];
  Orphan<capnp::DynamicStruct> result_1;
  StructSchema structSchema;
  String local_a68;
  String local_a50;
  ArrayPtr<const_char> local_a38;
  int local_a28;
  undefined4 uStack_a24;
  undefined1 auStack_a20 [56];
  Maybe<capnp::Orphan<capnp::DynamicValue>_> local_9e8;
  undefined1 local_9a8 [8];
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> value;
  undefined1 local_960 [4];
  uint i;
  Builder dstList;
  undefined1 local_918 [8];
  Orphan<capnp::DynamicList> result;
  Reader srcList;
  Type elementType;
  ListSchema listSchema;
  String local_888;
  String local_870;
  ArrayPtr<const_char> local_858;
  ArrayPtr<const_unsigned_char> local_848;
  Orphan<capnp::Data> local_838;
  ValueTranslator *local_818;
  Type TStack_810;
  String local_800;
  String local_7e8;
  ArrayPtr<const_char> local_7d0;
  ArrayPtr<const_char> local_7c0;
  Orphan<capnp::Text> local_7b0;
  ArrayPtr<const_unsigned_char> local_790;
  ArrayPtr<const_unsigned_char> local_780;
  Orphan<capnp::Data> local_770;
  undefined1 local_750 [8];
  Reader text_1;
  ArrayPtr<const_char> local_738;
  uint64_t local_728;
  uint64_t nValue;
  Schema local_710;
  Reader local_708;
  Orphan<capnp::DynamicStruct> local_6d0;
  word *local_6a8;
  int iStack_6a0;
  word *local_698;
  word *pwStack_690;
  undefined1 local_680 [8];
  FlatArrayMessageReader reader;
  ReaderOptions options;
  Array<capnp::word> local_558;
  ArrayPtr<const_capnp::word> local_540;
  undefined1 auStack_530 [8];
  ArrayPtr<const_capnp::word> words;
  Array<capnp::word> copy;
  ArrayPtr<const_unsigned_char> local_4f8;
  Orphan<capnp::Data> local_4e8;
  BuilderFor<capnp::Text> local_4c8;
  undefined1 local_4b0 [8];
  Orphan<capnp::Text> text;
  Maybe<kj::Array<const_unsigned_char>_> local_460;
  undefined1 local_440 [8];
  NullableValue<kj::Array<const_unsigned_char>_> data;
  Maybe<capnp::DynamicValue::Reader> local_3a0;
  undefined1 local_350 [8];
  NullableValue<capnp::DynamicValue::Reader> constValue_1;
  Maybe<capnp::DynamicValue::Reader> local_288;
  undefined1 local_238 [8];
  NullableValue<capnp::DynamicValue::Reader> constValue;
  StringPtr local_1d8;
  StringPtr local_1c8;
  StringPtr local_1b8;
  StringPtr local_1a0;
  uint local_18c;
  RawBrandedSchema *local_188;
  undefined8 uStack_180;
  SegmentReader *local_178;
  CapTableReader *pCStack_170;
  void *local_168;
  WirePointer *pWStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [2] [12];
  char *local_128;
  char *pcStack_120;
  Schema local_110;
  Maybe<capnp::EnumSchema::Enumerant> local_108;
  undefined1 local_c0 [8];
  NullableValue<capnp::EnumSchema::Enumerant> enumerant;
  char *local_70;
  undefined1 auStack_68 [8];
  StringPtr id;
  Reader name;
  ValueTranslator *this_local;
  Type type_local;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  type_local.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)__return_storage_ptr__;
  WVar10 = Expression::Reader::which(&src);
  switch(WVar10) {
  case UNKNOWN:
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    break;
  case POSITIVE_INT:
    uVar21 = Expression::Reader::getPositiveInt(&src);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,uVar21);
    break;
  case NEGATIVE_INT:
    uVar21 = Expression::Reader::getNegativeInt(&src);
    local_728 = uVar21;
    uVar22 = kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
    if ((uVar22 >> 1) + 1 < uVar21) {
      pEVar2 = this->errorReporter;
      kj::StringPtr::StringPtr((StringPtr *)&local_738,"Integer is too big to be negative.");
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (pEVar2,&src,(StringPtr)local_738);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    }
    else {
      text_1.super_StringPtr.content.size_ = -local_728;
      value_00 = kj::implicitCast<long,unsigned_long>(&text_1.super_StringPtr.content.size_);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value_00);
    }
    break;
  case FLOAT:
    dVar3 = Expression::Reader::getFloat(&src);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,dVar3);
    break;
  case STRING:
    bVar9 = capnp::Type::isData((Type *)&this_local);
    if (bVar9) {
      _local_750 = (ArrayPtr<const_char>)Expression::Reader::getString(&src);
      local_790 = kj::StringPtr::asBytes((StringPtr *)local_750);
      Data::Reader::Reader((Reader *)&local_780,&local_790);
      Orphanage::newOrphanCopy<capnp::Data::Reader>(&local_770,&this->orphanage,(Reader)local_780);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Data>(__return_storage_ptr__,&local_770);
      Orphan<capnp::Data>::~Orphan(&local_770);
    }
    else {
      local_7c0 = (ArrayPtr<const_char>)Expression::Reader::getString(&src);
      Orphanage::newOrphanCopy<capnp::Text::Reader>(&local_7b0,&this->orphanage,(Reader)local_7c0);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Text>(__return_storage_ptr__,&local_7b0);
      Orphan<capnp::Text>::~Orphan(&local_7b0);
    }
    break;
  case RELATIVE_NAME:
    Expression::Reader::getRelativeName((Reader *)&id.content.size_,&src);
    join_0x00000010_0x00000000_ =
         (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&id.content.size_);
    auStack_68 = (undefined1  [8])enumerant.field_1._56_8_;
    id.content.ptr = local_70;
    bVar9 = capnp::Type::isEnum((Type *)&this_local);
    if (bVar9) {
      local_110.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&this_local);
      local_128 = (char *)auStack_68;
      pcStack_120 = id.content.ptr;
      name_00.content.size_ = (size_t)id.content.ptr;
      name_00.content.ptr = (char *)auStack_68;
      EnumSchema::findEnumerantByName(&local_108,(EnumSchema *)&local_110,name_00);
      other = kj::_::readMaybe<capnp::EnumSchema::Enumerant>(&local_108);
      kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
                ((NullableValue<capnp::EnumSchema::Enumerant> *)local_c0,other);
      kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_108);
      pEVar13 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_c0);
      if (pEVar13 != (Enumerant *)0x0) {
        pEVar14 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator*
                            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_c0);
        local_188 = (pEVar14->parent).super_Schema.raw;
        uStack_180 = *(undefined8 *)&pEVar14->ordinal;
        uVar4 = pEVar14->parent;
        uVar5 = pEVar14->ordinal;
        uVar6 = *(undefined2 *)&pEVar14->field_0xa;
        enumerant_00._10_2_ = uVar6;
        enumerant_00.ordinal = uVar5;
        enumerant_00.parent.super_Schema.raw = (Schema)(Schema)uVar4;
        local_178 = (pEVar14->proto)._reader.segment;
        pCStack_170 = (pEVar14->proto)._reader.capTable;
        local_168 = (pEVar14->proto)._reader.data;
        pWStack_160 = (pEVar14->proto)._reader.pointers;
        local_158._0_4_ = (pEVar14->proto)._reader.dataSize;
        local_158._4_2_ = (pEVar14->proto)._reader.pointerCount;
        local_158._6_2_ = *(undefined2 *)&(pEVar14->proto)._reader.field_0x26;
        uStack_150 = *(undefined8 *)&(pEVar14->proto)._reader.nestingLimit;
        enumerant_00._12_4_ = (int)((ulong)uStack_180 >> 0x20);
        enumerant_00.proto._reader.segment._0_4_ = (int)local_178;
        enumerant_00.proto._reader.segment._4_4_ = (int)((ulong)local_178 >> 0x20);
        enumerant_00.proto._reader.capTable._0_4_ = (int)pCStack_170;
        enumerant_00.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_170 >> 0x20);
        enumerant_00.proto._reader.data._0_4_ = (int)local_168;
        enumerant_00.proto._reader.data._4_4_ = (int)((ulong)local_168 >> 0x20);
        enumerant_00.proto._reader.pointers._0_4_ = (int)pWStack_160;
        enumerant_00.proto._reader.pointers._4_4_ = (int)((ulong)pWStack_160 >> 0x20);
        enumerant_00.proto._reader.dataSize = (undefined4)local_158;
        enumerant_00.proto._reader.pointerCount = local_158._4_2_;
        enumerant_00.proto._reader._38_2_ = local_158._6_2_;
        enumerant_00.proto._reader._40_8_ = uStack_150;
        DynamicEnum::DynamicEnum((DynamicEnum *)local_148,enumerant_00);
        value_02._12_4_ = 0;
        value_02.schema.super_Schema.raw = (Schema)(Schema)local_148[0]._0_8_;
        value_02.value = local_148[0]._8_2_;
        value_02._10_2_ = local_148[0]._10_2_;
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value_02);
      }
      local_18c = (uint)(pEVar13 != (Enumerant *)0x0);
      kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
                ((NullableValue<capnp::EnumSchema::Enumerant> *)local_c0);
      if (local_18c != 0) {
        return __return_storage_ptr__;
      }
    }
    else {
      kj::StringPtr::StringPtr(&local_1a0,"void");
      bVar9 = kj::StringPtr::operator==((StringPtr *)auStack_68,&local_1a0);
      if (bVar9) {
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      kj::StringPtr::StringPtr(&local_1b8,"true");
      bVar9 = kj::StringPtr::operator==((StringPtr *)auStack_68,&local_1b8);
      if (bVar9) {
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,true);
        return __return_storage_ptr__;
      }
      kj::StringPtr::StringPtr(&local_1c8,"false");
      bVar9 = kj::StringPtr::operator==((StringPtr *)auStack_68,&local_1c8);
      if (bVar9) {
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,false);
        return __return_storage_ptr__;
      }
      kj::StringPtr::StringPtr(&local_1d8,"nan");
      this_00 = (StringPtr *)auStack_68;
      bVar9 = kj::StringPtr::operator==(this_00,&local_1d8);
      if (bVar9) {
        dVar3 = kj::nan((char *)this_00);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,SUB84(dVar3,0));
        return __return_storage_ptr__;
      }
      kj::StringPtr::StringPtr((StringPtr *)((long)&constValue.field_1 + 0x40),"inf");
      bVar9 = kj::StringPtr::operator==
                        ((StringPtr *)auStack_68,(StringPtr *)((long)&constValue.field_1 + 0x40));
      if (bVar9) {
        value_01 = kj::inf();
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value_01);
        return __return_storage_ptr__;
      }
    }
    (**this->resolver->_vptr_Resolver)();
    pNVar15 = kj::_::readMaybe<capnp::DynamicValue::Reader>(&local_288);
    kj::_::NullableValue<capnp::DynamicValue::Reader>::NullableValue
              ((NullableValue<capnp::DynamicValue::Reader> *)local_238,pNVar15);
    kj::Maybe<capnp::DynamicValue::Reader>::~Maybe(&local_288);
    pRVar16 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_238);
    if (pRVar16 == (Reader *)0x0) {
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    }
    else {
      pRVar16 = kj::_::NullableValue<capnp::DynamicValue::Reader>::operator*
                          ((NullableValue<capnp::DynamicValue::Reader> *)local_238);
      DynamicValue::Reader::Reader((Reader *)((long)&constValue_1.field_1 + 0x40),pRVar16);
      Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
                (__return_storage_ptr__,&this->orphanage,
                 (Reader *)((long)&constValue_1.field_1 + 0x40));
      DynamicValue::Reader::~Reader((Reader *)((long)&constValue_1.field_1 + 0x40));
    }
    local_18c = 1;
    kj::_::NullableValue<capnp::DynamicValue::Reader>::~NullableValue
              ((NullableValue<capnp::DynamicValue::Reader> *)local_238);
    break;
  case LIST:
    bVar9 = capnp::Type::isList((Type *)&this_local);
    if (bVar9) {
      join_0x00000010_0x00000000_ = (Type)capnp::Type::asList((Type *)&this_local);
      TVar25 = ListSchema::getElementType((ListSchema *)&elementType.field_4);
      __return_storage_ptr___00 = &result.builder.location;
      Expression::Reader::getList((Reader *)__return_storage_ptr___00,&src);
      uVar8 = listSchema.elementType._0_8_;
      dstList.builder._32_8_ = elementType.field_4;
      uVar12 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::size
                         ((Reader *)__return_storage_ptr___00);
      schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)uVar8;
      schema.elementType._0_8_ = dstList.builder._32_8_;
      Orphanage::newOrphan((Orphan<capnp::DynamicList> *)local_918,&this->orphanage,schema,uVar12);
      Orphan<capnp::DynamicList>::get((Builder *)local_960,(Orphan<capnp::DynamicList> *)local_918);
      for (value.field_1._52_4_ = 0; uVar7 = value.field_1._52_4_,
          uVar12 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::size
                             ((Reader *)&result.builder.location), (uint)uVar7 < uVar12;
          value.field_1._52_4_ = value.field_1._52_4_ + 1) {
        List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)(auStack_a20 + 8),(Reader *)&result.builder.location,
                   value.field_1._52_4_);
        srcList.reader._40_8_ = TVar25._0_8_;
        elementType._0_8_ = TVar25.field_4;
        local_a28 = srcList.reader.nestingLimit;
        uStack_a24 = srcList.reader._44_4_;
        auStack_a20._0_2_ = elementType.baseType;
        auStack_a20[2] = elementType.listDepth;
        auStack_a20[3] = elementType.isImplicitParam;
        auStack_a20._4_2_ = elementType.field_3;
        auStack_a20._6_2_ = elementType._6_2_;
        src_00._reader.capTable._0_4_ = (int)auStack_a20._16_8_;
        src_00._reader.segment = (SegmentReader *)auStack_a20._8_8_;
        src_00._reader.capTable._4_4_ = SUB84(auStack_a20._16_8_,4);
        src_00._reader.data._0_4_ = (int)auStack_a20._24_8_;
        src_00._reader.data._4_4_ = SUB84(auStack_a20._24_8_,4);
        src_00._reader.pointers._0_4_ = (int)auStack_a20._32_8_;
        src_00._reader.pointers._4_4_ = SUB84(auStack_a20._32_8_,4);
        src_00._reader.dataSize = (int)auStack_a20._40_8_;
        src_00._reader._36_4_ = SUB84(auStack_a20._40_8_,4);
        src_00._reader.nestingLimit = (int)auStack_a20._48_8_;
        src_00._reader._44_4_ = SUB84(auStack_a20._48_8_,4);
        compileValue(&local_9e8,this,src_00,TVar25);
        other_02 = kj::_::readMaybe<capnp::Orphan<capnp::DynamicValue>>(&local_9e8);
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_9a8,other_02);
        kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::~Maybe(&local_9e8);
        pOVar23 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_9a8);
        uVar7 = value.field_1._52_4_;
        if (pOVar23 != (Orphan<capnp::DynamicValue> *)0x0) {
          pOVar23 = kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::operator*
                              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_9a8);
          pOVar23 = kj::mv<capnp::Orphan<capnp::DynamicValue>>(pOVar23);
          DynamicList::Builder::adopt((Builder *)local_960,uVar7,pOVar23);
        }
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_9a8);
      }
      other_03 = kj::mv<capnp::Orphan<capnp::DynamicList>>((Orphan<capnp::DynamicList> *)local_918);
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicList>(__return_storage_ptr__,other_03);
      local_18c = 1;
      Orphan<capnp::DynamicList>::~Orphan((Orphan<capnp::DynamicList> *)local_918);
    }
    else {
      pEVar2 = this->errorReporter;
      type_01.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)type_local._0_8_;
      type_01._0_8_ = this_local;
      makeTypeName(&local_888,this,type_01);
      kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
                (&local_870,(kj *)"Type mismatch; expected ",(char (*) [25])&local_888,
                 (String *)0x5281f0,in_R8);
      kj::StringPtr::StringPtr((StringPtr *)&local_858,&local_870);
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (pEVar2,&src,(StringPtr)local_858);
      kj::String::~String(&local_870);
      kj::String::~String(&local_888);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    }
    break;
  case TUPLE:
    bVar9 = capnp::Type::isStruct((Type *)&this_local);
    if (bVar9) {
      local_ab0.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&this_local);
      result_1.builder.location = (word *)local_ab0.raw;
      Orphanage::newOrphan
                ((Orphan<capnp::DynamicStruct> *)local_aa8,&this->orphanage,
                 (StructSchema)local_ab0.raw);
      Orphan<capnp::DynamicStruct>::get(&local_ae0,(Orphan<capnp::DynamicStruct> *)local_aa8);
      Expression::Reader::getTuple(&local_b10,&src);
      builder.builder.segment._0_4_ = (int)local_ae0.builder.segment;
      builder.schema.super_Schema.raw = local_ae0.schema.super_Schema.raw;
      builder.builder.segment._4_4_ = (int)((ulong)local_ae0.builder.segment >> 0x20);
      builder.builder.capTable._0_4_ = (int)local_ae0.builder.capTable;
      builder.builder.capTable._4_4_ = (int)((ulong)local_ae0.builder.capTable >> 0x20);
      builder.builder.data._0_4_ = (int)local_ae0.builder.data;
      builder.builder.data._4_4_ = (int)((ulong)local_ae0.builder.data >> 0x20);
      builder.builder.pointers._0_4_ = (int)local_ae0.builder.pointers;
      builder.builder.pointers._4_4_ = (int)((ulong)local_ae0.builder.pointers >> 0x20);
      builder.builder.dataSize = local_ae0.builder.dataSize;
      builder.builder._36_4_ = local_ae0.builder._36_4_;
      assignments.reader.capTable = local_b10.reader.capTable;
      assignments.reader.segment = local_b10.reader.segment;
      assignments.reader.ptr = local_b10.reader.ptr;
      assignments.reader.elementCount = local_b10.reader.elementCount;
      assignments.reader.step = local_b10.reader.step;
      assignments.reader.structDataSize = local_b10.reader.structDataSize;
      assignments.reader.structPointerCount = local_b10.reader.structPointerCount;
      assignments.reader.elementSize = local_b10.reader.elementSize;
      assignments.reader._39_1_ = local_b10.reader._39_1_;
      assignments.reader.nestingLimit = local_b10.reader.nestingLimit;
      assignments.reader._44_4_ = local_b10.reader._44_4_;
      fillStructValue(this,builder,assignments);
      other_04 = kj::mv<capnp::Orphan<capnp::DynamicStruct>>
                           ((Orphan<capnp::DynamicStruct> *)local_aa8);
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,other_04);
      local_18c = 1;
      Orphan<capnp::DynamicStruct>::~Orphan((Orphan<capnp::DynamicStruct> *)local_aa8);
    }
    else {
      pEVar2 = this->errorReporter;
      type_00.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)type_local._0_8_;
      type_00._0_8_ = this_local;
      makeTypeName(&local_a68,this,type_00);
      kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
                (&local_a50,(kj *)"Type mismatch; expected ",(char (*) [25])&local_a68,
                 (String *)0x5281f0,in_R8);
      kj::StringPtr::StringPtr((StringPtr *)&local_a38,&local_a50);
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (pEVar2,&src,(StringPtr)local_a38);
      kj::String::~String(&local_a50);
      kj::String::~String(&local_a68);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    }
    break;
  case BINARY:
    bVar9 = capnp::Type::isData((Type *)&this_local);
    if (bVar9) {
      local_848 = (ArrayPtr<const_unsigned_char>)Expression::Reader::getBinary(&src);
      Orphanage::newOrphanCopy<capnp::Data::Reader>(&local_838,&this->orphanage,(Reader)local_848);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Data>(__return_storage_ptr__,&local_838);
      Orphan<capnp::Data>::~Orphan(&local_838);
    }
    else {
      pEVar2 = this->errorReporter;
      local_818 = this_local;
      TStack_810.baseType = type_local.baseType;
      TStack_810.listDepth = type_local.listDepth;
      TStack_810.isImplicitParam = type_local.isImplicitParam;
      TStack_810.field_3 = type_local.field_3;
      TStack_810._6_2_ = type_local._6_2_;
      TVar25.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)type_local._0_8_;
      TVar25._0_8_ = this_local;
      makeTypeName(&local_800,this,TVar25);
      kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
                (&local_7e8,(kj *)"Type mismatch; expected ",(char (*) [25])&local_800,
                 (String *)0x5281f0,in_R8);
      kj::StringPtr::StringPtr((StringPtr *)&local_7d0,&local_7e8);
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (pEVar2,&src,(StringPtr)local_7d0);
      kj::String::~String(&local_7e8);
      kj::String::~String(&local_800);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    }
    break;
  case APPLICATION:
  case MEMBER:
  case ABSOLUTE_NAME:
  case IMPORT:
    (**this->resolver->_vptr_Resolver)();
    pNVar15 = kj::_::readMaybe<capnp::DynamicValue::Reader>(&local_3a0);
    kj::_::NullableValue<capnp::DynamicValue::Reader>::NullableValue
              ((NullableValue<capnp::DynamicValue::Reader> *)local_350,pNVar15);
    kj::Maybe<capnp::DynamicValue::Reader>::~Maybe(&local_3a0);
    pRVar16 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_350);
    if (pRVar16 == (Reader *)0x0) {
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    }
    else {
      pRVar16 = kj::_::NullableValue<capnp::DynamicValue::Reader>::operator*
                          ((NullableValue<capnp::DynamicValue::Reader> *)local_350);
      DynamicValue::Reader::Reader((Reader *)((long)&data.field_1 + 0x10),pRVar16);
      Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
                (__return_storage_ptr__,&this->orphanage,(Reader *)((long)&data.field_1 + 0x10));
      DynamicValue::Reader::~Reader((Reader *)((long)&data.field_1 + 0x10));
    }
    local_18c = 1;
    kj::_::NullableValue<capnp::DynamicValue::Reader>::~NullableValue
              ((NullableValue<capnp::DynamicValue::Reader> *)local_350);
    break;
  case EMBED:
    pRVar1 = this->resolver;
    Expression::Reader::getEmbed((Reader *)&text.builder.location,&src);
    (*pRVar1->_vptr_Resolver[1])();
    other_00 = kj::_::readMaybe<kj::Array<unsigned_char_const>>(&local_460);
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::NullableValue
              ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440,other_00);
    kj::Maybe<kj::Array<const_unsigned_char>_>::~Maybe(&local_460);
    pAVar17 = kj::_::NullableValue::operator_cast_to_Array_((NullableValue *)local_440);
    if (pAVar17 == (Array<const_unsigned_char> *)0x0) {
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
      local_18c = 1;
    }
    else {
      WVar11 = capnp::Type::which((Type *)&this_local);
      if (WVar11 == TEXT) {
        pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                            ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
        sVar18 = kj::Array<const_unsigned_char>::size(pAVar17);
        Orphanage::newOrphan<capnp::Text>
                  ((Orphan<capnp::Text> *)local_4b0,&this->orphanage,(uint)sVar18);
        Orphan<capnp::Text>::get(&local_4c8,(Orphan<capnp::Text> *)local_4b0);
        __dest = Text::Builder::begin(&local_4c8);
        pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                            ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
        puVar19 = kj::Array<const_unsigned_char>::begin(pAVar17);
        pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                            ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
        sVar18 = kj::Array<const_unsigned_char>::size(pAVar17);
        memcpy(__dest,puVar19,sVar18);
        other_01 = kj::mv<capnp::Orphan<capnp::Text>>((Orphan<capnp::Text> *)local_4b0);
        Orphan<capnp::DynamicValue>::Orphan<capnp::Text>(__return_storage_ptr__,other_01);
        local_18c = 1;
        Orphan<capnp::Text>::~Orphan((Orphan<capnp::Text> *)local_4b0);
      }
      else if (WVar11 == DATA) {
        pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator*
                            ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
        Data::Reader::Reader((Reader *)&local_4f8,pAVar17);
        Orphanage::newOrphanCopy<capnp::Data::Reader>(&local_4e8,&this->orphanage,(Reader)local_4f8)
        ;
        Orphan<capnp::DynamicValue>::Orphan<capnp::Data>(__return_storage_ptr__,&local_4e8);
        Orphan<capnp::Data>::~Orphan(&local_4e8);
        local_18c = 1;
      }
      else if (WVar11 == STRUCT) {
        pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                            ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
        sVar18 = kj::Array<const_unsigned_char>::size(pAVar17);
        if ((sVar18 & 7) == 0) {
          kj::Array<capnp::word>::Array((Array<capnp::word> *)&words.size_);
          kj::ArrayPtr<const_capnp::word>::ArrayPtr((ArrayPtr<const_capnp::word> *)auStack_530);
          pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                              ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
          puVar19 = kj::Array<const_unsigned_char>::begin(pAVar17);
          if (((ulong)puVar19 & 7) == 0) {
            pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                                ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
            pwVar20 = (word *)kj::Array<const_unsigned_char>::begin(pAVar17);
            pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                                ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
            sVar18 = kj::Array<const_unsigned_char>::size(pAVar17);
            kj::ArrayPtr<const_capnp::word>::ArrayPtr(&local_540,pwVar20,sVar18 >> 3);
            AVar24.size_ = local_540.size_;
            AVar24.ptr = local_540.ptr;
          }
          else {
            pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                                ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
            sVar18 = kj::Array<const_unsigned_char>::size(pAVar17);
            kj::heapArray<capnp::word>(&local_558,sVar18 >> 3);
            kj::Array<capnp::word>::operator=((Array<capnp::word> *)&words.size_,&local_558);
            kj::Array<capnp::word>::~Array(&local_558);
            pwVar20 = kj::Array<capnp::word>::begin((Array<capnp::word> *)&words.size_);
            pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                                ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
            puVar19 = kj::Array<const_unsigned_char>::begin(pAVar17);
            pAVar17 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator->
                                ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
            sVar18 = kj::Array<const_unsigned_char>::size(pAVar17);
            memcpy(pwVar20,puVar19,sVar18);
            AVar24 = kj::Array::operator_cast_to_ArrayPtr((Array *)&words.size_);
          }
          words.ptr = (word *)AVar24.size_;
          auStack_530 = (undefined1  [8])AVar24.ptr;
          ReaderOptions::ReaderOptions
                    ((ReaderOptions *)&reader.super_UnalignedFlatArrayMessageReader.end);
          reader.super_UnalignedFlatArrayMessageReader.end =
               (word *)kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
          iStack_6a0 = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
          local_698 = (word *)auStack_530;
          pwStack_690 = words.ptr;
          local_6a8 = reader.super_UnalignedFlatArrayMessageReader.end;
          array.size_ = (size_t)words.ptr;
          array.ptr = (word *)auStack_530;
          options_00.nestingLimit = iStack_6a0;
          options_00.traversalLimitInWords =
               (uint64_t)reader.super_UnalignedFlatArrayMessageReader.end;
          options_00._12_4_ = 0;
          FlatArrayMessageReader::FlatArrayMessageReader
                    ((FlatArrayMessageReader *)local_680,array,options_00);
          local_710.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&this_local);
          MessageReader::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                    (&local_708,(MessageReader *)local_680,(StructSchema)local_710.raw);
          copyFrom.reader.segment._0_4_ = (int)local_708.reader.segment;
          copyFrom.schema.super_Schema.raw = local_708.schema.super_Schema.raw;
          copyFrom.reader.segment._4_4_ = (int)((ulong)local_708.reader.segment >> 0x20);
          copyFrom.reader.capTable._0_4_ = (int)local_708.reader.capTable;
          copyFrom.reader.capTable._4_4_ = (int)((ulong)local_708.reader.capTable >> 0x20);
          copyFrom.reader.data._0_4_ = (int)local_708.reader.data;
          copyFrom.reader.data._4_4_ = (int)((ulong)local_708.reader.data >> 0x20);
          copyFrom.reader.pointers._0_4_ = (int)local_708.reader.pointers;
          copyFrom.reader.pointers._4_4_ = (int)((ulong)local_708.reader.pointers >> 0x20);
          copyFrom.reader.dataSize = local_708.reader.dataSize;
          copyFrom.reader._36_4_ = local_708.reader._36_4_;
          copyFrom.reader.nestingLimit = local_708.reader.nestingLimit;
          copyFrom.reader._44_4_ = local_708.reader._44_4_;
          Orphanage::newOrphanCopy<capnp::DynamicStruct::Reader>
                    (&local_6d0,&this->orphanage,copyFrom);
          Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>
                    (__return_storage_ptr__,&local_6d0);
          Orphan<capnp::DynamicStruct>::~Orphan(&local_6d0);
          local_18c = 1;
          FlatArrayMessageReader::~FlatArrayMessageReader((FlatArrayMessageReader *)local_680);
          kj::Array<capnp::word>::~Array((Array<capnp::word> *)&words.size_);
        }
        else {
          pEVar2 = this->errorReporter;
          kj::StringPtr::StringPtr
                    ((StringPtr *)&copy.disposer,
                     "Embedded file is not a valid Cap\'n Proto message.");
          ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                    (pEVar2,&src,(StringPtr)stack0xfffffffffffffaf8);
          Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
          local_18c = 1;
        }
      }
      else {
        pEVar2 = this->errorReporter;
        kj::StringPtr::StringPtr
                  ((StringPtr *)&nValue,
                   "Embeds can only be used when Text, Data, or a struct is expected.");
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar2,&src,(StringPtr)_nValue);
        Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
        local_18c = 1;
      }
    }
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue
              ((NullableValue<kj::Array<const_unsigned_char>_> *)local_440);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> ValueTranslator::compileValueInner(Expression::Reader src, Type type) {
  switch (src.which()) {
    case Expression::RELATIVE_NAME: {
      auto name = src.getRelativeName();

      // The name is just a bare identifier.  It may be a literal value or an enumerant.
      kj::StringPtr id = name.getValue();

      if (type.isEnum()) {
        KJ_IF_MAYBE(enumerant, type.asEnum().findEnumerantByName(id)) {
          return DynamicEnum(*enumerant);
        }
      } else {
        // Interpret known constant values.
        if (id == "void") {
          return VOID;
        } else if (id == "true") {
          return true;
        } else if (id == "false") {
          return false;
        } else if (id == "nan") {
          return kj::nan();
        } else if (id == "inf") {
          return kj::inf();
        }
      }

      // Apparently not a literal. Try resolving it.
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME:
    case Expression::IMPORT:
    case Expression::APPLICATION:
    case Expression::MEMBER:
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }

    case Expression::EMBED:
      KJ_IF_MAYBE(data, resolver.readEmbed(src.getEmbed())) {
        switch (type.which()) {
          case schema::Type::TEXT: {
            // Sadly, we need to make a copy to add the NUL terminator.
            auto text = orphanage.newOrphan<Text>(data->size());
            memcpy(text.get().begin(), data->begin(), data->size());
            return kj::mv(text);
          }
          case schema::Type::DATA:
            // TODO(perf): It would arguably be neat to use orphanage.referenceExternalData(),
            //   since typically the data is mmap()ed and this would avoid forcing a large file
            //   to become memory-resident. However, we'd have to figure out who should own the
            //   Array<byte>. Also, we'd have to deal with the possibility of misaligned data --
            //   though arguably in that case we know it's not mmap()ed so whatever. One more
            //   thing: it would be neat to be able to reference text blobs this way too, if only
            //   we could rely on the assumption that as long as the data doesn't end on a page
            //   boundary, it will be zero-padded, thus giving us our NUL terminator (4095/4096 of
            //   the time), but this seems to require documenting constraints on the underlying
            //   file-reading interfaces. Hm.
            return orphanage.newOrphanCopy(Data::Reader(*data));
          case schema::Type::STRUCT: {
            // We will almost certainly
            if (data->size() % sizeof(word) != 0) {
              errorReporter.addErrorOn(src,
                  "Embedded file is not a valid Cap'n Proto message.");
              return nullptr;
            }
            kj::Array<word> copy;
            kj::ArrayPtr<const word> words;
            if (reinterpret_cast<uintptr_t>(data->begin()) % sizeof(void*) == 0) {
              // Hooray, data is aligned.
              words = kj::ArrayPtr<const word>(
                  reinterpret_cast<const word*>(data->begin()),
                  data->size() / sizeof(word));
            } else {
              // Ugh, data not aligned. Make a copy.
              copy = kj::heapArray<word>(data->size() / sizeof(word));
              memcpy(copy.begin(), data->begin(), data->size());
              words = copy;
            }
            ReaderOptions options;
            options.traversalLimitInWords = kj::maxValue;
            options.nestingLimit = kj::maxValue;
            FlatArrayMessageReader reader(words, options);
            return orphanage.newOrphanCopy(reader.getRoot<DynamicStruct>(type.asStruct()));
          }
          default:
            errorReporter.addErrorOn(src,
                "Embeds can only be used when Text, Data, or a struct is expected.");
            return nullptr;
        }
      } else {
        return nullptr;
      }

    case Expression::POSITIVE_INT:
      return src.getPositiveInt();

    case Expression::NEGATIVE_INT: {
      uint64_t nValue = src.getNegativeInt();
      if (nValue > ((uint64_t)kj::maxValue >> 1) + 1) {
        errorReporter.addErrorOn(src, "Integer is too big to be negative.");
        return nullptr;
      } else {
        return kj::implicitCast<int64_t>(-nValue);
      }
    }

    case Expression::FLOAT:
      return src.getFloat();
      break;

    case Expression::STRING:
      if (type.isData()) {
        Text::Reader text = src.getString();
        return orphanage.newOrphanCopy(Data::Reader(text.asBytes()));
      } else {
        return orphanage.newOrphanCopy(src.getString());
      }
      break;

    case Expression::BINARY:
      if (!type.isData()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      return orphanage.newOrphanCopy(src.getBinary());

    case Expression::LIST: {
      if (!type.isList()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto listSchema = type.asList();
      Type elementType = listSchema.getElementType();
      auto srcList = src.getList();
      Orphan<DynamicList> result = orphanage.newOrphan(listSchema, srcList.size());
      auto dstList = result.get();
      for (uint i = 0; i < srcList.size(); i++) {
        KJ_IF_MAYBE(value, compileValue(srcList[i], elementType)) {
          dstList.adopt(i, kj::mv(*value));
        }
      }
      return kj::mv(result);
    }

    case Expression::TUPLE: {
      if (!type.isStruct()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto structSchema = type.asStruct();
      Orphan<DynamicStruct> result = orphanage.newOrphan(structSchema);
      fillStructValue(result.get(), src.getTuple());
      return kj::mv(result);
    }

    case Expression::UNKNOWN:
      // Ignore earlier error.
      return nullptr;
  }

  KJ_UNREACHABLE;
}